

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

void __thiscall QGraphicsAnchorLayoutPrivate::deleteLayoutEdges(QGraphicsAnchorLayoutPrivate *this)

{
  QGraphicsLayoutItem *item;
  AnchorVertex *pAVar1;
  AnchorVertex *pAVar2;
  
  item = (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr;
  pAVar1 = internalVertex(this,item,AnchorLeft);
  pAVar2 = internalVertex(this,item,AnchorRight);
  removeAnchor_helper(this,pAVar1,pAVar2);
  pAVar1 = internalVertex(this,item,AnchorTop);
  pAVar2 = internalVertex(this,item,AnchorBottom);
  removeAnchor_helper(this,pAVar1,pAVar2);
  return;
}

Assistant:

void QGraphicsAnchorLayoutPrivate::deleteLayoutEdges()
{
    Q_Q(QGraphicsAnchorLayout);

    Q_ASSERT(!internalVertex(q, Qt::AnchorHorizontalCenter));
    Q_ASSERT(!internalVertex(q, Qt::AnchorVerticalCenter));

    removeAnchor_helper(internalVertex(q, Qt::AnchorLeft),
                        internalVertex(q, Qt::AnchorRight));
    removeAnchor_helper(internalVertex(q, Qt::AnchorTop),
                        internalVertex(q, Qt::AnchorBottom));
}